

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O2

uint8_t * __thiscall VC1StreamReader::findNextFrame(VC1StreamReader *this,uint8_t *buffer)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *end;
  
  end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  while( true ) {
    puVar1 = VC1Unit::findNextMarker(buffer,end);
    end = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    if ((end + -4 <= puVar1) || ((puVar1[3] & 0xef) != 0xc)) break;
    buffer = puVar1 + 4;
  }
  puVar2 = (uint8_t *)0x0;
  if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
    puVar2 = end;
  }
  if (puVar1 < end + -4) {
    puVar2 = puVar1;
  }
  return puVar2;
}

Assistant:

uint8_t* VC1StreamReader::findNextFrame(uint8_t* buffer) const
{
    for (uint8_t* nal = VC1Unit::findNextMarker(buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = VC1Unit::findNextMarker(nal + 4, m_bufEnd))
    {
        const auto vc1Code = static_cast<VC1Code>(nal[3]);
        if (vc1Code != VC1Code::FIELD && vc1Code != VC1Code::USER_FIELD)
            return nal;
    }
    if (m_eof)
        return m_bufEnd;
    return nullptr;
}